

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O3

duckdb_fsst_encoder_t * duckdb_fsst_create(size_t n,size_t *lenIn,u8 **strIn,int zeroTerminated)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer puVar1;
  _Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false> _Var2;
  SymbolTable *pSVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  u8 *sampleBuf;
  duckdb_fsst_encoder_t *__s;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> sample;
  _Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false> local_70;
  SymbolTable *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_58;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> local_40;
  
  sampleBuf = (u8 *)operator_new__(0x8000);
  local_70._M_head_impl = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  makeSample(&local_40,sampleBuf,strIn,lenIn,n + (n == 0),
             (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              *)&local_70);
  __s = (duckdb_fsst_encoder_t *)operator_new(0x180010);
  switchD_01043a80::default(__s,0,0x180010);
  if (local_70._M_head_impl != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    lenIn = ((local_70._M_head_impl)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(&local_58,&local_40);
  local_68 = buildSymbolTable((Counters *)(__s + 2),&local_58,lenIn,zeroTerminated != 0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<SymbolTable*>(&_Stack_60,local_68)
  ;
  _Var4._M_pi = _Stack_60._M_pi;
  pSVar3 = local_68;
  local_68 = (SymbolTable *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__s[1];
  *__s = pSVar3;
  __s[1] = _Var4._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  if (local_58.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete__(sampleBuf);
  if (local_40.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Var2._M_head_impl = local_70._M_head_impl;
  if (local_70._M_head_impl != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    puVar1 = ((local_70._M_head_impl)->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    operator_delete(_Var2._M_head_impl);
  }
  return __s;
}

Assistant:

duckdb_fsst_encoder_t* duckdb_fsst_create(size_t n, size_t lenIn[], u8 *strIn[], int zeroTerminated) {
	u8* sampleBuf = new u8[FSST_SAMPLEMAXSZ];
	unique_ptr<vector<size_t>> sample_sizes;
	vector<u8*> sample = makeSample(sampleBuf, strIn, lenIn, n?n:1, sample_sizes); // careful handling of input to get a right-size and representative sample
	Encoder *encoder = new Encoder();
	size_t* sampleLen = sample_sizes ? sample_sizes->data() : &lenIn[0];
	encoder->symbolTable = shared_ptr<SymbolTable>(buildSymbolTable(encoder->counters, sample, sampleLen, zeroTerminated));
	delete[] sampleBuf;
	return (duckdb_fsst_encoder_t*) encoder;
}